

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.c
# Opt level: O1

int linear_expansion_sum_zeroelim(int elen,float *e,int flen,float *f,float *h)

{
  int iVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  bool bVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  fVar11 = *e;
  fVar13 = *f;
  bVar9 = fVar11 < fVar13 == fVar13 <= -fVar11;
  if (bVar9) {
    fVar12 = f[1];
    fVar10 = fVar13;
  }
  else {
    fVar10 = fVar11;
    fVar11 = e[1];
    fVar12 = fVar13;
  }
  uVar7 = (ulong)!bVar9;
  uVar4 = (ulong)bVar9;
  uVar5 = (uint)!bVar9;
  if (((int)uVar5 < elen) && ((flen <= (int)(uint)bVar9 || (fVar11 < fVar12 != fVar12 <= -fVar11))))
  {
    fVar13 = fVar11 + fVar10;
    fVar14 = fVar13 - fVar11;
    uVar7 = (ulong)(uVar5 + 1);
    fVar11 = e[uVar7];
  }
  else {
    fVar13 = fVar12 + fVar10;
    fVar14 = fVar13 - fVar12;
    uVar4 = (ulong)(bVar9 + 1);
    fVar12 = f[uVar4];
  }
  fVar10 = fVar10 - fVar14;
  iVar1 = 0;
  if (2 < flen + elen) {
    iVar8 = flen + elen + -2;
    iVar1 = 0;
    fVar14 = fVar13;
    do {
      iVar6 = (int)uVar7;
      iVar3 = (int)uVar4;
      if ((iVar6 < elen) && ((flen <= iVar3 || (fVar11 < fVar12 != fVar12 <= -fVar11)))) {
        fVar15 = fVar10 + fVar11;
        fVar13 = fVar15 - fVar11;
        uVar7 = (ulong)(iVar6 + 1);
        fVar11 = e[(long)iVar6 + 1];
      }
      else {
        fVar15 = fVar10 + fVar12;
        fVar13 = fVar15 - fVar12;
        uVar4 = (ulong)(iVar3 + 1);
        fVar12 = f[(long)iVar3 + 1];
      }
      fVar10 = fVar10 - fVar13;
      if ((fVar10 != 0.0) || (NAN(fVar10))) {
        lVar2 = (long)iVar1;
        iVar1 = iVar1 + 1;
        h[lVar2] = fVar10;
      }
      fVar13 = fVar14 + fVar15;
      fVar10 = (fVar14 - (fVar13 - (fVar13 - fVar14))) + (fVar15 - (fVar13 - fVar14));
      iVar8 = iVar8 + -1;
      fVar14 = fVar13;
    } while (iVar8 != 0);
  }
  if ((fVar10 != 0.0) || (NAN(fVar10))) {
    lVar2 = (long)iVar1;
    iVar1 = iVar1 + 1;
    h[lVar2] = fVar10;
  }
  if (((fVar13 == 0.0) && (!NAN(fVar13))) && (iVar1 != 0)) {
    return iVar1;
  }
  h[iVar1] = fVar13;
  return iVar1 + 1;
}

Assistant:

int linear_expansion_sum_zeroelim(elen, e, flen, f, h)/* h cannot be e or f. */
int elen;
REAL *e;
int flen;
REAL *f;
REAL *h;
{
  REAL Q, q, hh;
  INEXACT REAL Qnew;
  INEXACT REAL R;
  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  int eindex, findex, hindex;
  int count;
  REAL enow, fnow;
  REAL g0;

  enow = e[0];
  fnow = f[0];
  eindex = findex = 0;
  hindex = 0;
  if ((fnow > enow) == (fnow > -enow)) {
    g0 = enow;
    enow = e[++eindex];
  } else {
    g0 = fnow;
    fnow = f[++findex];
  }
  if ((eindex < elen) && ((findex >= flen)
                          || ((fnow > enow) == (fnow > -enow)))) {
    Fast_Two_Sum(enow, g0, Qnew, q);
    enow = e[++eindex];
  } else {
    Fast_Two_Sum(fnow, g0, Qnew, q);
    fnow = f[++findex];
  }
  Q = Qnew;
  for (count = 2; count < elen + flen; count++) {
    if ((eindex < elen) && ((findex >= flen)
                            || ((fnow > enow) == (fnow > -enow)))) {
      Fast_Two_Sum(enow, q, R, hh);
      enow = e[++eindex];
    } else {
      Fast_Two_Sum(fnow, q, R, hh);
      fnow = f[++findex];
    }
    Two_Sum(Q, R, Qnew, q);
    Q = Qnew;
    if (hh != 0) {
      h[hindex++] = hh;
    }
  }
  if (q != 0) {
    h[hindex++] = q;
  }
  if ((Q != 0.0) || (hindex == 0)) {
    h[hindex++] = Q;
  }
  return hindex;
}